

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O3

void __thiscall
JsUtil::CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler>::Add
          (CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *this,
          EvalMapStringInternal<false> *value)

{
  uint uVar1;
  char16_t *pcVar2;
  ModuleID MVar3;
  BOOL BVar4;
  BOOL BVar5;
  bool bVar6;
  uint uVar7;
  CharacterBuffer<char16_t> *addr;
  
  bVar6 = Contains(this,value);
  if (!bVar6) {
    uVar1 = this->writeIndex;
    addr = &this->entries[uVar1].str;
    this->entries[uVar1].owningVar = value->owningVar;
    pcVar2 = (value->str).string.ptr;
    Memory::Recycler::WBSetBit((char *)addr);
    (addr->string).ptr = pcVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    this->entries[uVar1].str.len = (value->str).len;
    MVar3 = value->moduleID;
    BVar4 = value->strict;
    BVar5 = value->isLibraryCode;
    this->entries[uVar1].hash = value->hash;
    this->entries[uVar1].moduleID = MVar3;
    this->entries[uVar1].strict = BVar4;
    this->entries[uVar1].isLibraryCode = BVar5;
    uVar1 = this->writeIndex;
    uVar7 = ((uVar1 + 1) / 0xf) * -0xf + uVar1 + 1;
    if ((uVar7 < uVar1) && (this->filled == false)) {
      this->filled = true;
    }
    this->writeIndex = uVar7;
  }
  return;
}

Assistant:

void Add(const T& value)
        {
            if (!Contains(value))
            {
                entries[writeIndex] = value;
                uint nextIndex = (writeIndex + 1) % size;
                if (nextIndex < writeIndex && !filled)
                {
                    filled = true;
                }

                writeIndex = nextIndex;
            }
        }